

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializePayload0.cpp
# Opt level: O2

FormatError __thiscall
trackerboy::deserializePayload0TU::LegacyInstHandler::processIn
          (LegacyInstHandler *this,Module *mod,InputBlock *block,size_t index)

{
  InstrumentTable *this_00;
  Instrument *inst;
  size_t id;
  long lVar1;
  
  this_00 = Module::instrumentTable(mod);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    inst = Table<trackerboy::Instrument>::operator[](this_00,(int)lVar1);
    if (inst != (Instrument *)0x0) {
      InstHandler::deserializeInstrument(block,inst);
    }
  }
  return none;
}

Assistant:

FormatError processIn(Module &mod, InputBlock &block, size_t index) {
        (void)index;

        auto &itable = mod.instrumentTable();
        for (size_t id = 0; id != InstrumentTable::MAX_SIZE; ++id) {
            auto inst = itable[id];
            if (inst) {
                // same format as major 1
                InstHandler::deserializeInstrument(block, *inst);
            }
        }

        return FormatError::none;
    }